

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void stbi__start_file(stbi__context *s,FILE *f)

{
  stbi__start_callbacks(s,&stbi__stdio_callbacks,f);
  return;
}

Assistant:

static void stbi__start_file(stbi__context *s, FILE *f)
{
   stbi__start_callbacks(s, &stbi__stdio_callbacks, (void *) f);
}